

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<test_result_(unsigned_int)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(unsigned_int)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001b8178;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<unsigned_int>.impl_.value_ =
       (MatcherInterface<unsigned_int> *)0x0;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<unsigned_int>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f0_.super_MatcherBase<unsigned_int>.impl_.link_;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<unsigned_int>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b81c8;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}